

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zutil.c
# Opt level: O0

void zprint_lu_col(char *msg,int jcol,int pivrow,int_t *xprune,GlobalLU_t *Glu)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int_t *piVar4;
  int_t *piVar5;
  void *pvVar6;
  int_t *piVar7;
  void *pvVar8;
  int_t *piVar9;
  int_t *piVar10;
  bool bVar11;
  int_t *xusub;
  int_t *usub;
  doublecomplex *ucol;
  int_t *xlusup;
  doublecomplex *lusup;
  int_t *lsub;
  int_t *xlsub;
  int fsupc;
  int *supno;
  int *xsup;
  int_t k;
  int_t i;
  GlobalLU_t *Glu_local;
  int_t *xprune_local;
  int pivrow_local;
  int jcol_local;
  char *msg_local;
  
  piVar2 = Glu->xsup;
  piVar3 = Glu->supno;
  piVar4 = Glu->lsub;
  piVar5 = Glu->xlsub;
  pvVar6 = Glu->lusup;
  piVar7 = Glu->xlusup;
  pvVar8 = Glu->ucol;
  piVar9 = Glu->usub;
  piVar10 = Glu->xusub;
  printf("%s",msg);
  printf("col %d: pivrow %d, supno %d, xprune %lld\n",(ulong)(uint)jcol,(ulong)(uint)pivrow,
         (ulong)(uint)piVar3[jcol],(long)xprune[jcol]);
  printf("\tU-col:\n");
  xsup._4_4_ = piVar10[jcol];
  while( true ) {
    if (piVar10[jcol + 1] <= xsup._4_4_) break;
    printf("\t%d%10.4f, %10.4f\n",*(undefined8 *)((long)pvVar8 + (long)xsup._4_4_ * 0x10),
           *(undefined8 *)((long)pvVar8 + (long)xsup._4_4_ * 0x10 + 8),
           (ulong)(uint)piVar9[xsup._4_4_]);
    xsup._4_4_ = xsup._4_4_ + 1;
  }
  printf("\tL-col in rectangular snode:\n");
  iVar1 = piVar2[piVar3[jcol]];
  xsup._4_4_ = piVar5[iVar1];
  xsup._0_4_ = piVar7[jcol];
  while( true ) {
    bVar11 = false;
    if (xsup._4_4_ < piVar5[iVar1 + 1]) {
      bVar11 = (int_t)xsup < piVar7[jcol + 1];
    }
    if (!bVar11) break;
    printf("\t%d\t%10.4f, %10.4f\n",*(undefined8 *)((long)pvVar6 + (long)(int_t)xsup * 0x10),
           *(undefined8 *)((long)pvVar6 + (long)(int_t)xsup * 0x10 + 8),
           (ulong)(uint)piVar4[xsup._4_4_]);
    xsup._4_4_ = xsup._4_4_ + 1;
    xsup._0_4_ = (int_t)xsup + 1;
  }
  fflush(_stdout);
  return;
}

Assistant:

void
zprint_lu_col(char *msg, int jcol, int pivrow, int_t *xprune, GlobalLU_t *Glu)
{
    int_t    i, k;
    int     *xsup, *supno, fsupc;
    int_t   *xlsub, *lsub;
    doublecomplex  *lusup;
    int_t   *xlusup;
    doublecomplex  *ucol;
    int_t   *usub, *xusub;

    xsup    = Glu->xsup;
    supno   = Glu->supno;
    lsub    = Glu->lsub;
    xlsub   = Glu->xlsub;
    lusup   = (doublecomplex *) Glu->lusup;
    xlusup  = Glu->xlusup;
    ucol    = (doublecomplex *) Glu->ucol;
    usub    = Glu->usub;
    xusub   = Glu->xusub;
    
    printf("%s", msg);
    printf("col %d: pivrow %d, supno %d, xprune %lld\n", 
	   jcol, pivrow, supno[jcol], (long long) xprune[jcol]);
    
    printf("\tU-col:\n");
    for (i = xusub[jcol]; i < xusub[jcol+1]; i++)
	printf("\t%d%10.4f, %10.4f\n", (int)usub[i], ucol[i].r, ucol[i].i);
    printf("\tL-col in rectangular snode:\n");
    fsupc = xsup[supno[jcol]];	/* first col of the snode */
    i = xlsub[fsupc];
    k = xlusup[jcol];
    while ( i < xlsub[fsupc+1] && k < xlusup[jcol+1] ) {
	printf("\t%d\t%10.4f, %10.4f\n", (int)lsub[i], lusup[k].r, lusup[k].i);
	i++; k++;
    }
    fflush(stdout);
}